

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  VMEMcache *cache;
  void *pvVar3;
  size_t sVar4;
  int i;
  uint uVar5;
  char *pcVar6;
  size_t sStack_50;
  char local_3c [8];
  char buf [12];
  
  if (argc == 3) {
    lVar2 = vmemcache_new();
    cache = (VMEMcache *)vmemcache_new();
    if ((lVar2 != 0) && (cache != (VMEMcache *)0x0)) {
      vmemcache_set_size(lVar2,0xa00000);
      vmemcache_set_size(cache,0x100000);
      iVar1 = vmemcache_add(lVar2,argv[1]);
      if (iVar1 == 0) {
        iVar1 = vmemcache_add(cache,argv[2]);
        if (iVar1 == 0) {
          vmemcache_callback_on_evict(cache,evict_demote,lVar2);
          vmemcache_callback_on_miss(cache,miss_promote,lVar2);
          pvVar3 = mmap((void *)0x0,0x80000,1,0x8022,-1,0);
          if (pvVar3 != (void *)0x0) {
            vmemcache_put(cache,"first",6,pvVar3,0x80000);
            vmemcache_put(cache,"second",7,pvVar3,0x80000);
            vmemcache_put(cache,"third",6,pvVar3,0x80000);
            get(cache,"first",0);
            get(cache,"first",0);
            get(cache,"second",0);
            get(cache,"third",0);
            get(cache,"nonexistent",1);
            for (uVar5 = 0; uVar5 != 0x13; uVar5 = uVar5 + 1) {
              snprintf(local_3c,0xc,"%d",(ulong)uVar5);
              sVar4 = strlen(local_3c);
              vmemcache_put(cache,local_3c,sVar4 + 1,pvVar3,0x80000);
            }
            get(cache,"first",1);
            get(cache,"second",1);
            get(cache,"third",0);
            return 0;
          }
          fprintf(_stderr,"can\'t mmap zeroes: %m\n");
          goto LAB_001014a8;
        }
        pcVar6 = argv[2];
      }
      else {
        pcVar6 = argv[1];
      }
      fprintf(_stderr,anon_var_dwarf_63,pcVar6);
      goto LAB_001014a8;
    }
    pcVar6 = "VMEMcache_new failed\n";
    sStack_50 = 0x15;
  }
  else {
    pcVar6 = "Usage: twolevel <L1dir> <L2dir>\n";
    sStack_50 = 0x20;
  }
  fwrite(pcVar6,sStack_50,1,_stderr);
LAB_001014a8:
  exit(1);
}

Assistant:

int
main(int argc, const char **argv)
{
	if (argc != 3)
		ERR("Usage: twolevel <L1dir> <L2dir>\n");

	VMEMcache *pmem = vmemcache_new();
	VMEMcache *dram = vmemcache_new();
	if (!pmem || !dram)
	    ERR("VMEMcache_new failed\n");

	vmemcache_set_size(pmem, L2_CAPACITY);
	vmemcache_set_size(dram, L1_CAPACITY);

	if (vmemcache_add(pmem, argv[1]))
		ERR("vmemcache_add(“%s”) failed: %m\n", argv[1]);
	if (vmemcache_add(dram, argv[2]))
		ERR("vmemcache_add(“%s”) failed: %m\n", argv[2]);

	vmemcache_callback_on_evict(dram, evict_demote, pmem);
	vmemcache_callback_on_miss(dram, miss_promote, pmem);

	void *lotta_zeroes = mmap(NULL, ZSIZE, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes)
		ERR("can't mmap zeroes: %m\n");

#define PUT(x)  vmemcache_put(dram, x, strlen(x) + 1, lotta_zeroes, ZSIZE)
#define GET(x)  get(dram, x, 0)
#define GETF(x) get(dram, x, 1)

	PUT("first");
	PUT("second");
	PUT("third");
	GET("first");
	GET("first");
	GET("second");
	GET("third");
	GETF("nonexistent");

	const int cap = (L1_CAPACITY / ZSIZE - 1)
		+ (L2_CAPACITY / ZSIZE - 1)
		- 1;

	for (int i = 0; i < cap; i++) {
		char buf[12];
		snprintf(buf, sizeof(buf), "%d", i);
		PUT(buf);
	}
	/* "first" and "second" should have been dropped, "third" is still in */
	GETF("first");
	GETF("second");
	GET("third");

	return 0;
}